

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O0

Mat * __thiscall Mat::col(Mat *this,int st,int ed)

{
  vector<__int128,_std::allocator<__int128>_> *in_RSI;
  Mat *in_RDI;
  Mat *ret;
  Mat *__n;
  pointer *this_00;
  undefined8 in_stack_ffffffffffffffa8;
  __normal_iterator<const___int128_*,_std::vector<__int128,_std::allocator<__int128>_>_> __last;
  __normal_iterator<const___int128_*,_std::vector<__int128,_std::allocator<__int128>_>_>
  in_stack_ffffffffffffffb0;
  
  __n = in_RDI;
  Mat((Mat *)in_stack_ffffffffffffffb0._M_current,(int)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
      (int)in_stack_ffffffffffffffa8);
  __last._M_current = (__int128 *)&__n->val;
  this_00 = &(in_RSI->super__Vector_base<__int128,_std::allocator<__int128>_>)._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  std::vector<__int128,_std::allocator<__int128>_>::begin
            ((vector<__int128,_std::allocator<__int128>_> *)in_RDI);
  __gnu_cxx::__normal_iterator<const___int128_*,_std::vector<__int128,_std::allocator<__int128>_>_>
  ::operator+((__normal_iterator<const___int128_*,_std::vector<__int128,_std::allocator<__int128>_>_>
               *)this_00,(difference_type)__n);
  std::vector<__int128,_std::allocator<__int128>_>::begin
            ((vector<__int128,_std::allocator<__int128>_> *)in_RDI);
  __gnu_cxx::__normal_iterator<const___int128_*,_std::vector<__int128,_std::allocator<__int128>_>_>
  ::operator+((__normal_iterator<const___int128_*,_std::vector<__int128,_std::allocator<__int128>_>_>
               *)this_00,(difference_type)__n);
  std::vector<__int128,std::allocator<__int128>>::
  assign<__gnu_cxx::__normal_iterator<__int128_const*,std::vector<__int128,std::allocator<__int128>>>,void>
            (in_RSI,in_stack_ffffffffffffffb0,__last);
  return in_RDI;
}

Assistant:

Mat Mat::col(int st, int ed) const {
    Mat ret(r, (ed - st + c) % c);
    ret.val.assign(val.begin() + st * r, val.begin() + ed * r);
    return ret;
}